

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::CountBitsFunction::checkArguments
          (CountBitsFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  element_type pEVar1;
  SourceRange sourceRange;
  SourceRange callRange;
  bool bVar2;
  SourceLocation this_00;
  Type *this_01;
  reference ppEVar3;
  iterator this_02;
  iterator context_00;
  reference ppEVar4;
  ASTContext *in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  size_t in_RDI;
  SystemSubroutine *in_R8;
  SourceLocation in_R9;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  Compilation *comp;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *this_03;
  Type *pTVar5;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffff48;
  Expression *in_stack_ffffffffffffff70;
  Expression *arg_00;
  ASTContext *in_stack_ffffffffffffff78;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  in_stack_ffffffffffffff80;
  ASTContext *local_78;
  Type *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  Type *local_8;
  
  this_00 = (SourceLocation)ASTContext::getCompilation((ASTContext *)0x949bc1);
  this_03 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x2;
  pTVar5 = (Type *)0x7fffffff;
  callRange.endLoc = in_R9;
  callRange.startLoc = this_00;
  bVar2 = SystemSubroutine::checkArgCount
                    (in_R8,in_RCX,(bool)in_stack_ffffffffffffffaf,
                     (Args *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),callRange
                     ,in_RDI,(size_t)in_RCX);
  if (bVar2) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x949c5b);
    bVar2 = Type::isBitstreamType
                      ((Type *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                       (bool)in_stack_ffffffffffffffa7);
    if (bVar2) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      this_01 = not_null<const_slang::ast::Type_*>::operator*
                          ((not_null<const_slang::ast::Type_*> *)0x949cc3);
      ppEVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                          (in_RDX,0);
      pEVar1 = *ppEVar3;
      sourceRange.endLoc._7_1_ = SUB81((pEVar1->sourceRange).endLoc,7);
      sourceRange.startLoc = (pEVar1->sourceRange).startLoc;
      sourceRange.endLoc._0_7_ = *(undefined7 *)&(pEVar1->sourceRange).endLoc.field_0x0;
      bVar2 = Bitstream::checkClassAccess(in_stack_ffffffffffffff98,local_78,sourceRange);
      if (bVar2) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::subspan
                  ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)this_01,
                   (size_type)in_stack_ffffffffffffff48,(size_type)pTVar5);
        this_02 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                            (this_03);
        context_00 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                               (in_stack_ffffffffffffff48);
        while (bVar2 = __gnu_cxx::
                       operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                 ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                   *)pTVar5,
                                  (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                   *)this_03), ((bVar2 ^ 0xffU) & 1) != 0) {
          ppEVar4 = __gnu_cxx::
                    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                    ::operator*((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                 *)&stack0xffffffffffffff80);
          arg_00 = *ppEVar4;
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x949db4);
          bVar2 = Type::isIntegral(pTVar5);
          if (!bVar2) {
            pTVar5 = SystemSubroutine::badArg
                               ((SystemSubroutine *)this_02._M_current,
                                (ASTContext *)context_00._M_current,arg_00);
            return pTVar5;
          }
          __gnu_cxx::
          __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)&stack0xffffffffffffff80);
        }
        local_8 = Compilation::getIntType((Compilation *)this_00);
      }
      else {
        local_8 = Compilation::getErrorType((Compilation *)this_00);
      }
    }
    else {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      local_8 = SystemSubroutine::badArg
                          ((SystemSubroutine *)in_stack_ffffffffffffff80._M_current,
                           in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
  }
  else {
    local_8 = Compilation::getErrorType((Compilation *)this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, INT32_MAX))
            return comp.getErrorType();

        if (!args[0]->type->isBitstreamType())
            return badArg(context, *args[0]);

        if (!Bitstream::checkClassAccess(*args[0]->type, context, args[0]->sourceRange))
            return comp.getErrorType();

        for (auto arg : args.subspan(1)) {
            if (!arg->type->isIntegral())
                return badArg(context, *arg);
        }

        return comp.getIntType();
    }